

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O3

void grat1(double *a,double *x,double *r,double *p,double *q,double *eps)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  
  dVar1 = *a;
  dVar2 = *x;
  dVar3 = dVar1 * dVar2;
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    if ((dVar1 == 0.5) && (!NAN(dVar1))) {
      if (dVar2 < 0.0) {
        dVar1 = sqrt(dVar2);
      }
      else {
        dVar1 = SQRT(dVar2);
      }
      if (dVar2 < 0.25) {
        grat1::T1 = dVar1;
        dVar1 = erf1(&grat1::T1);
        *p = dVar1;
        *q = (0.5 - dVar1) + 0.5;
        return;
      }
      grat1::T3 = dVar1;
      dVar1 = erfc1(&grat1::K2,&grat1::T3);
      *q = dVar1;
      *p = (0.5 - dVar1) + 0.5;
      return;
    }
    if (1.1 <= dVar2) {
      dVar10 = (1.0 - dVar1) + dVar2;
      dVar6 = 1.0;
      dVar4 = 1.0;
      dVar5 = 1.0;
      dVar3 = dVar2;
      do {
        dVar6 = dVar6 * dVar4;
        dVar3 = dVar3 * dVar4;
        dVar4 = dVar4 + 1.0;
        dVar6 = dVar6 + dVar2 * dVar5;
        dVar3 = dVar3 + dVar2 * dVar10;
        dVar5 = dVar5 * (dVar4 - dVar1) + dVar6;
        dVar10 = (dVar4 - dVar1) * dVar10 + dVar3;
        auVar8._8_8_ = dVar6;
        auVar8._0_8_ = dVar5;
        auVar9._8_8_ = dVar3;
        auVar9._0_8_ = dVar10;
        auVar9 = divpd(auVar8,auVar9);
        dVar7 = auVar9._0_8_;
      } while (dVar7 * *eps <= ABS(dVar7 - auVar9._8_8_));
      dVar1 = *r;
      *q = dVar7 * dVar1;
      *p = (0.5 - dVar7 * dVar1) + 0.5;
      return;
    }
    dVar5 = 3.0;
    dVar4 = dVar2 / (dVar1 + 3.0);
    dVar6 = dVar2;
    do {
      dVar5 = dVar5 + 1.0;
      dVar6 = -dVar6 * (dVar2 / dVar5);
      dVar10 = dVar6 / (dVar1 + dVar5);
      dVar4 = dVar4 + dVar10;
    } while ((*eps * 0.1) / (dVar1 + 1.0) < ABS(dVar10));
    grat1::j = dVar3 * ((-0.5 / (dVar1 + 2.0) + dVar4 / 6.0) * dVar2 + 1.0 / (dVar1 + 1.0));
    dVar2 = log(dVar2);
    grat1::z = dVar2 * dVar1;
    grat1::h = gam1(a);
    grat1::g = grat1::h + 1.0;
    if (0.25 <= *x) {
      dVar1 = *x / 2.59;
      if (*a <= dVar1 && dVar1 != *a) goto LAB_00105595;
    }
    else if (-0.13394 < grat1::z) {
LAB_00105595:
      dVar1 = rexp(&grat1::z);
      dVar1 = ((dVar1 + 0.5 + 0.5) * grat1::j - dVar1) * grat1::g - grat1::h;
      *q = dVar1;
      if (0.0 <= dVar1) {
        *p = (0.5 - dVar1) + 0.5;
        return;
      }
      goto LAB_00105257;
    }
    dVar1 = exp(grat1::z);
    dVar1 = ((0.5 - grat1::j) + 0.5) * dVar1 * grat1::g;
    *p = dVar1;
    *q = (0.5 - dVar1) + 0.5;
  }
  else {
    if (dVar2 <= dVar1) {
      *p = 0.0;
      *q = 1.0;
      return;
    }
LAB_00105257:
    *p = 1.0;
    *q = 0.0;
  }
  return;
}

Assistant:

void grat1(double *a,double *x,double *r,double *p,double *q,
           double *eps)
{
static int K2 = 0;
static double a2n,a2nm1,am0,an,an0,b2n,b2nm1,c,cma,g,h,j,l,sum,t,tol,w,z,T1,T3;
/*
     ..
     .. Executable Statements ..
*/
/*
-----------------------------------------------------------------------
        EVALUATION OF THE INCOMPLETE GAMMA RATIO FUNCTIONS
                      P(A,X) AND Q(A,X)
     IT IS ASSUMED THAT A .LE. 1.  EPS IS THE TOLERANCE TO BE USED.
     THE INPUT ARGUMENT R HAS THE VALUE E**(-X)*X**A/GAMMA(A).
-----------------------------------------------------------------------
*/
    if(*a**x == 0.0e0) goto S120;
    if(*a == 0.5e0) goto S100;
    if(*x < 1.1e0) goto S10;
    goto S60;
S10:
/*
             TAYLOR SERIES FOR P(A,X)/X**A
*/
    an = 3.0e0;
    c = *x;
    sum = *x/(*a+3.0e0);
    tol = 0.1e0**eps/(*a+1.0e0);
S20:
    an += 1.0e0;
    c = -(c*(*x/an));
    t = c/(*a+an);
    sum += t;
    if(fabs(t) > tol) goto S20;
    j = *a**x*((sum/6.0e0-0.5e0/(*a+2.0e0))**x+1.0e0/(*a+1.0e0));
    z = *a*log(*x);
    h = gam1(a);
    g = 1.0e0+h;
    if(*x < 0.25e0) goto S30;
    if(*a < *x/2.59e0) goto S50;
    goto S40;
S30:
    if(z > -.13394e0) goto S50;
S40:
    w = exp(z);
    *p = w*g*(0.5e0+(0.5e0-j));
    *q = 0.5e0+(0.5e0-*p);
    return;
S50:
    l = rexp(&z);
    w = 0.5e0+(0.5e0+l);
    *q = (w*j-l)*g-h;
    if(*q < 0.0e0) goto S90;
    *p = 0.5e0+(0.5e0-*q);
    return;
S60:
/*
              CONTINUED FRACTION EXPANSION
*/
    a2nm1 = a2n = 1.0e0;
    b2nm1 = *x;
    b2n = *x+(1.0e0-*a);
    c = 1.0e0;
S70:
    a2nm1 = *x*a2n+c*a2nm1;
    b2nm1 = *x*b2n+c*b2nm1;
    am0 = a2nm1/b2nm1;
    c += 1.0e0;
    cma = c-*a;
    a2n = a2nm1+cma*a2n;
    b2n = b2nm1+cma*b2n;
    an0 = a2n/b2n;
    if(fabs(an0-am0) >= *eps*an0) goto S70;
    *q = *r*an0;
    *p = 0.5e0+(0.5e0-*q);
    return;
S80:
/*
                SPECIAL CASES
*/
    *p = 0.0e0;
    *q = 1.0e0;
    return;
S90:
    *p = 1.0e0;
    *q = 0.0e0;
    return;
S100:
    if(*x >= 0.25e0) goto S110;
    T1 = sqrt(*x);
    *p = erf1(&T1);
    *q = 0.5e0+(0.5e0-*p);
    return;
S110:
    T3 = sqrt(*x);
    *q = erfc1(&K2,&T3);
    *p = 0.5e0+(0.5e0-*q);
    return;
S120:
    if(*x <= *a) goto S80;
    goto S90;
}